

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::SlicePlane(SlicePlane *this,string *name_)

{
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  vec<3,_float,_(glm::qualifier)0> value__00;
  vec<3,_float,_(glm::qualifier)0> value__01;
  string *psVar1;
  ManagedBuffer<unsigned_int> *this_00;
  string *in_RSI;
  string *in_RDI;
  undefined1 auVar2 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar3;
  vec3 vVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [32];
  undefined1 in_stack_fffffffffffffad8 [64];
  SlicePlane *in_stack_fffffffffffffb18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb30;
  ManagedBufferRegistry *in_stack_fffffffffffffb38;
  ManagedBuffer<unsigned_int> *in_stack_fffffffffffffb40;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffb48;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffb50;
  string *in_stack_fffffffffffffb58;
  TransformationGizmo *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined8 in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  allocator *paVar8;
  string local_3f0 [39];
  undefined1 local_3c9;
  string local_3c8 [32];
  string *in_stack_fffffffffffffc58;
  Engine *in_stack_fffffffffffffc60;
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [8];
  SlicePlane *in_stack_fffffffffffffd00;
  string local_2e8 [32];
  ManagedBuffer<unsigned_int> *local_2c8;
  string local_2c0 [32];
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  string local_258 [32];
  undefined8 local_238;
  undefined4 local_230;
  undefined8 local_224;
  undefined4 local_21c;
  string local_218 [32];
  string local_1f8 [32];
  undefined8 local_1d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1d0;
  undefined8 local_1c8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c0;
  undefined8 local_1b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1b0;
  string local_1a8 [32];
  string local_188 [36];
  undefined4 local_164;
  undefined1 local_160 [64];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  undefined1 auVar6 [24];
  
  auVar6 = in_stack_fffffffffffffad8._0_24_;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  ::size((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
          *)polyscope::state::slicePlanes);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb18);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  PersistentValue<bool>::PersistentValue
            ((PersistentValue<bool> *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->name,
             SUB81((ulong)in_stack_fffffffffffffb40 >> 0x38,0));
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  PersistentValue<bool>::PersistentValue
            ((PersistentValue<bool> *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->name,
             SUB81((ulong)in_stack_fffffffffffffb40 >> 0x38,0));
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  PersistentValue<bool>::PersistentValue
            ((PersistentValue<bool> *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->name,
             SUB81((ulong)in_stack_fffffffffffffb40 >> 0x38,0));
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  auVar5 = auVar6._0_16_;
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  local_164 = 0x3f800000;
  glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(auVar5._8_8_,auVar5._0_8_);
  auVar2 = vmovdqu64_avx512f(local_160);
  auVar2 = vmovdqu64_avx512f(auVar2);
  auVar7 = auVar2._0_32_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (int)in_stack_fffffffffffffb68;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  value_.value[0]._0_8_ = in_stack_fffffffffffffb60;
  value_.value[1].field_0.x = in_stack_fffffffffffffb70.z;
  value_.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)in_stack_fffffffffffffb74;
  value_.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (int)in_stack_fffffffffffffb78;
  value_.value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  value_.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffb80;
  value_.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  value_.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (int)in_stack_fffffffffffffb88;
  value_.value[2].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  value_.value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffb90;
  value_.value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  value_.value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
       (int)in_stack_fffffffffffffb98;
  value_.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->name,value_);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  uVar3 = extraout_XMM0_Qb;
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar7._16_8_,auVar7._8_8_);
  vVar4 = getNextUniqueColor();
  local_1d0 = vVar4.field_2;
  auVar5._8_8_ = uVar3;
  auVar5._0_8_ = vVar4._0_8_;
  local_1d8 = vmovlpd_avx(auVar5);
  value__00.field_2 = in_stack_fffffffffffffb70;
  value__00.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffb68;
  value__00.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  local_1c8 = local_1d8;
  local_1c0 = local_1d0;
  local_1b8 = local_1d8;
  local_1b0 = local_1d0;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffffb50,
             &in_stack_fffffffffffffb48->name,value__00);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar7._16_8_,auVar7._8_8_);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_224,0.97,0.97,0.97);
  local_230 = local_21c;
  local_238 = local_224;
  value__01.field_2 = in_stack_fffffffffffffb70;
  value__01.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffb68;
  value__01.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffffb50,
             &in_stack_fffffffffffffb48->name,value__01);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar7._16_8_,auVar7._8_8_);
  PersistentValue<float>::PersistentValue
            ((PersistentValue<float> *)in_stack_fffffffffffffb50,&in_stack_fffffffffffffb48->name,
             (float)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  in_RDI[0x1a8] = (string)0x0;
  psVar1 = in_RDI + 0x1b0;
  paVar8 = &local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(psVar1,"",paVar8);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x45fc39);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar7._16_8_,auVar7._8_8_);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
            ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)(in_RDI + 0xb8));
  TransformationGizmo::TransformationGizmo
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,(mat4 *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_2c0);
  auVar6 = auVar7._0_24_;
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::array(auVar7._24_8_);
  psVar1 = in_RDI + 0x360;
  local_3c9 = 1;
  local_2c8 = (ManagedBuffer<unsigned_int> *)psVar1;
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::operator[]
            (auVar6._8_8_,auVar6._0_8_);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb28);
  local_2c8 = (ManagedBuffer<unsigned_int> *)(psVar1 + 0xe8);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::operator[]
            (auVar6._8_8_,auVar6._0_8_);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb28);
  local_2c8 = (ManagedBuffer<unsigned_int> *)(psVar1 + 0x1d0);
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::operator[]
            (auVar6._8_8_,auVar6._0_8_);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
             in_stack_fffffffffffffb28);
  this_00 = (ManagedBuffer<unsigned_int> *)(psVar1 + 0x2b8);
  local_2c8 = this_00;
  uniquePrefix_abi_cxx11_(in_stack_fffffffffffffb18);
  auVar5 = auVar6._0_16_;
  std::operator+(auVar6._16_8_,auVar6._8_8_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::operator[]
            (auVar5._8_8_,auVar5._0_8_);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (this_00,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  local_3c9 = 0;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc58);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_308);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x45ffb9);
  std::__cxx11::string::string(local_3f0,in_RDI + 0x20);
  render::Engine::addSlicePlane(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_3f0);
  PersistentValue<bool>::operator=(auVar5._8_8_,auVar5._0_8_);
  prepare(in_stack_fffffffffffffd00);
  return;
}

Assistant:

SlicePlane::SlicePlane(std::string name_)
    : name(name_), postfix(std::to_string(state::slicePlanes.size())), active(uniquePrefix() + "#active", true),
      drawPlane(uniquePrefix() + "#drawPlane", true), drawWidget(uniquePrefix() + "#drawWidget", true),
      objectTransform(uniquePrefix() + "#object_transform", glm::mat4(1.0)),
      color(uniquePrefix() + "#color", getNextUniqueColor()),
      gridLineColor(uniquePrefix() + "#gridLineColor", glm::vec3{.97, .97, .97}),
      transparency(uniquePrefix() + "#transparency", 0.5), shouldInspectMesh(false), inspectedMeshName(""),
      transformGizmo(uniquePrefix() + "#transformGizmo", objectTransform.get(), &objectTransform),
      sliceBufferArr{{{nullptr, uniquePrefix() + "#slice1", sliceBufferDataArr[0]},
                      {nullptr, uniquePrefix() + "#slice2", sliceBufferDataArr[1]},
                      {nullptr, uniquePrefix() + "#slice3", sliceBufferDataArr[2]},
                      {nullptr, uniquePrefix() + "#slice4", sliceBufferDataArr[3]}}}

{
  render::engine->addSlicePlane(postfix);
  transformGizmo.enabled = true;
  prepare();
}